

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_GenerateFileOut(Vec_Str_t *vPatchLine,char *pFileNameF,char *pFileNameOut,Vec_Str_t *vPatch
                        )

{
  char *__haystack;
  FILE *__s;
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  
  __haystack = Extra_FileReadContents(pFileNameF);
  if (__haystack != (char *)0x0) {
    __s = fopen(pFileNameOut,"wb");
    if (__s != (FILE *)0x0) {
      pcVar1 = strstr(__haystack,"endmodule");
      iVar3 = (int)pcVar1 - (int)__haystack;
      sVar2 = strlen(__haystack);
      fwrite(__haystack,(long)iVar3,1,__s);
      fprintf(__s,"\n%s",vPatchLine->pArray);
      fwrite(__haystack + iVar3,(long)((int)sVar2 - iVar3),1,__s);
      if (vPatch != (Vec_Str_t *)0x0) {
        fprintf(__s,"\n%s\n",vPatch->pArray);
      }
    }
    free(__haystack);
    fclose(__s);
    return;
  }
  return;
}

Assistant:

void Acb_GenerateFileOut( Vec_Str_t * vPatchLine, char * pFileNameF, char * pFileNameOut, Vec_Str_t * vPatch )
{
    FILE * pFileOut;
    char * pBuffer = Extra_FileReadContents( pFileNameF );
    if ( pBuffer == NULL )
        return;
    pFileOut = fopen( pFileNameOut, "wb" );
    if ( pFileOut )
    {
        char * pTemp = strstr( pBuffer, "endmodule" );
        int nFirst = pTemp-pBuffer, nSecond = strlen(pBuffer) - nFirst;
        int Value = fwrite( pBuffer, nFirst, 1, pFileOut );
        fprintf( pFileOut, "\n%s", Vec_StrArray(vPatchLine) );
        Value = fwrite( pBuffer+nFirst, nSecond, 1, pFileOut );
        if ( vPatch )
            fprintf( pFileOut, "\n%s\n", Vec_StrArray(vPatch) );
    }
    ABC_FREE( pBuffer );
    fclose( pFileOut );
}